

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int ns_avprintf(char **buf,size_t size,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  int local_4c;
  undefined8 uStack_48;
  int len;
  va_list ap_copy;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t size_local;
  char **buf_local;
  
  ap_copy[0].overflow_arg_area = ap->reg_save_area;
  uStack_48._0_4_ = ap->gp_offset;
  uStack_48._4_4_ = ap->fp_offset;
  ap_copy[0]._0_8_ = ap->overflow_arg_area;
  local_4c = vsnprintf(*buf,size,fmt,&uStack_48);
  if (local_4c < 0) {
    *buf = (char *)0x0;
    fmt_local = (char *)size;
    while (local_4c < 0) {
      if (*buf != (char *)0x0) {
        free(*buf);
      }
      fmt_local = (char *)((long)fmt_local << 1);
      pcVar1 = (char *)malloc((size_t)fmt_local);
      *buf = pcVar1;
      if (pcVar1 == (char *)0x0) {
        return local_4c;
      }
      ap_copy[0].overflow_arg_area = ap->reg_save_area;
      uStack_48._0_4_ = ap->gp_offset;
      uStack_48._4_4_ = ap->fp_offset;
      ap_copy[0]._0_8_ = ap->overflow_arg_area;
      local_4c = vsnprintf(*buf,(size_t)fmt_local,fmt,&uStack_48);
    }
  }
  else if ((int)size < local_4c) {
    pcVar1 = (char *)malloc((long)(local_4c + 1));
    *buf = pcVar1;
    if (pcVar1 == (char *)0x0) {
      local_4c = -1;
    }
    else {
      ap_copy[0].overflow_arg_area = ap->reg_save_area;
      uStack_48._0_4_ = ap->gp_offset;
      uStack_48._4_4_ = ap->fp_offset;
      ap_copy[0]._0_8_ = ap->overflow_arg_area;
      local_4c = vsnprintf(*buf,(long)(local_4c + 1),fmt,&uStack_48);
    }
  }
  return local_4c;
}

Assistant:

int ns_avprintf(char **buf, size_t size, const char *fmt, va_list ap) {
  va_list ap_copy;
  int len;

  va_copy(ap_copy, ap);
  len = vsnprintf(*buf, size, fmt, ap_copy);
  va_end(ap_copy);

  if (len < 0) {
    // eCos and Windows are not standard-compliant and return -1 when
    // the buffer is too small. Keep allocating larger buffers until we
    // succeed or out of memory.
    *buf = NULL;
    while (len < 0) {
      if (*buf) free(*buf);
      size *= 2;
      if ((*buf = (char *) NS_MALLOC(size)) == NULL) break;
      va_copy(ap_copy, ap);
      len = vsnprintf(*buf, size, fmt, ap_copy);
      va_end(ap_copy);
    }
  } else if (len > (int) size) {
    // Standard-compliant code path. Allocate a buffer that is large enough.
    if ((*buf = (char *) NS_MALLOC(len + 1)) == NULL) {
      len = -1;
    } else {
      va_copy(ap_copy, ap);
      len = vsnprintf(*buf, len + 1, fmt, ap_copy);
      va_end(ap_copy);
    }
  }

  return len;
}